

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall ON_SubDComponentList::UpdateContentSerialNumbers(ON_SubDComponentList *this)

{
  ON__UINT64 OVar1;
  ON_SubDComponentList *this_local;
  
  OVar1 = ON_SubD::GeometryContentSerialNumber(&this->m_subd);
  this->m_subd_geometry_content_serial_number = OVar1;
  OVar1 = ON_SubD::RenderContentSerialNumber(&this->m_subd);
  this->m_subd_render_content_serial_number = OVar1;
  return;
}

Assistant:

void ON_SubDComponentList::UpdateContentSerialNumbers()
{
  m_subd_geometry_content_serial_number = m_subd.GeometryContentSerialNumber();
  m_subd_render_content_serial_number = m_subd.RenderContentSerialNumber();
}